

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

int ctemplate_htmlparser::jsparser_parse(jsparser_ctx *ctx,char *str,int size)

{
  int iVar1;
  int internal_state;
  int size_local;
  char *str_local;
  jsparser_ctx *ctx_local;
  
  iVar1 = statemachine_parse(ctx->statemachine,str,size);
  iVar1 = state_external(iVar1);
  return iVar1;
}

Assistant:

int jsparser_parse(jsparser_ctx *ctx, const char *str, int size)
{
    int internal_state;
    internal_state = statemachine_parse(ctx->statemachine, str, size);
    return state_external(internal_state);
}